

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int16_t iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *palVar18;
  __m128i *ptr;
  __m128i *ptr_00;
  int16_t *ptr_01;
  long lVar19;
  ulong uVar20;
  int iVar21;
  char *pcVar22;
  int iVar23;
  int iVar24;
  __m128i *ptr_02;
  uint uVar25;
  long lVar26;
  long lVar27;
  char *__format;
  long lVar28;
  ulong uVar29;
  int32_t segNum;
  long lVar30;
  int iVar31;
  ulong size;
  undefined4 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  ulong uVar40;
  undefined1 auVar41 [16];
  __m128i alVar42;
  undefined1 auVar43 [16];
  short sVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  __m128i alVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar52 [16];
  short sVar59;
  undefined1 auVar53 [16];
  ushort uVar60;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar70;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  short sVar32;
  short sVar38;
  short sVar44;
  short sVar69;
  short sVar71;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar22 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar22 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar22 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar22 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar22 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar22 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar22 = "open";
        }
        else {
          if (-1 < gap) {
            uVar25 = uVar3 - 1;
            size = (ulong)uVar3 + 7 >> 3;
            uVar40 = (ulong)uVar25 % size;
            iVar31 = -open;
            iVar21 = ppVar5->min;
            iVar24 = -iVar21;
            if (iVar21 != iVar31 && SBORROW4(iVar21,iVar31) == iVar21 + open < 0) {
              iVar24 = open;
            }
            iVar14 = ppVar5->max;
            ppVar17 = parasail_result_new_rowcol1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag = ppVar17->flag | 0x8240801;
              palVar18 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar18 != (__m128i *)0x0)) {
                iVar16 = s2Len + -1;
                iVar23 = 7 - (int)(uVar25 / size);
                auVar34 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar33 = auVar34._0_4_;
                auVar41._4_4_ = uVar33;
                auVar41._0_4_ = uVar33;
                auVar41._8_4_ = uVar33;
                auVar41._12_4_ = uVar33;
                auVar34 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar33 = auVar34._0_4_;
                auVar35 = pshuflw(ZEXT416(iVar24 - 0x7fff),ZEXT416(iVar24 - 0x7fff),0);
                auVar36._0_4_ = auVar35._0_4_;
                auVar36._4_4_ = auVar36._0_4_;
                auVar36._8_4_ = auVar36._0_4_;
                auVar36._12_4_ = auVar36._0_4_;
                auVar34 = ZEXT416(CONCAT22((short)((uint)iVar21 >> 0x10),0x7ffe - (short)iVar14));
                auVar39 = pshuflw(auVar34,auVar34,0);
                auVar34._0_4_ = auVar39._0_4_;
                auVar34._4_4_ = auVar34._0_4_;
                auVar34._8_4_ = auVar34._0_4_;
                auVar34._12_4_ = auVar34._0_4_;
                lVar26 = (long)iVar31;
                for (uVar29 = 0; uVar29 != size; uVar29 = uVar29 + 1) {
                  lVar28 = lVar26;
                  for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
                    lVar27 = -0x8000;
                    if (-0x8000 < lVar28) {
                      lVar27 = lVar28;
                    }
                    lVar19 = lVar28 - (ulong)(uint)open;
                    if (lVar19 < -0x7fff) {
                      lVar19 = -0x8000;
                    }
                    *(short *)((long)&h + lVar30 * 2) = (short)lVar27;
                    *(short *)((long)&e + lVar30 * 2) = (short)lVar19;
                    lVar28 = lVar28 - size * (uint)gap;
                  }
                  palVar18[uVar29][0] = h.m[0];
                  palVar18[uVar29][1] = h.m[1];
                  ptr_00[uVar29][0] = e.m[0];
                  ptr_00[uVar29][1] = e.m[1];
                  lVar26 = lVar26 - (ulong)(uint)gap;
                }
                *ptr_01 = 0;
                for (uVar29 = 1; s2Len + 1 != uVar29; uVar29 = uVar29 + 1) {
                  iVar15 = -0x8000;
                  if (-0x8000 < iVar31) {
                    iVar15 = (int16_t)iVar31;
                  }
                  ptr_01[uVar29] = iVar15;
                  iVar31 = iVar31 - gap;
                }
                iVar21 = (int)size;
                lVar26 = size * 0x10;
                uVar29 = 0;
                auVar52 = auVar36;
                do {
                  ptr_02 = palVar18;
                  if (uVar29 == (uint)s2Len) {
                    for (uVar29 = 0; (uint)(iVar21 * 4) != uVar29; uVar29 = uVar29 + 4) {
                      psVar2 = (short *)((long)*ptr_02 + uVar29 * 4);
                      sVar32 = psVar2[1];
                      sVar38 = psVar2[2];
                      sVar7 = psVar2[3];
                      sVar8 = psVar2[4];
                      sVar9 = psVar2[5];
                      sVar10 = psVar2[6];
                      sVar11 = psVar2[7];
                      piVar6 = ((ppVar17->field_4).rowcols)->score_col;
                      *(int *)((long)piVar6 + uVar29) = (int)*psVar2;
                      *(int *)((long)piVar6 + (uint)(iVar21 * 4) + uVar29) = (int)sVar32;
                      *(int *)((long)piVar6 + size * 8 + uVar29) = (int)sVar38;
                      *(int *)((long)piVar6 + size * 0xc + uVar29) = (int)sVar7;
                      *(int *)((long)piVar6 + lVar26 + uVar29) = (int)sVar8;
                      *(int *)((long)piVar6 + size * 0x14 + uVar29) = (int)sVar9;
                      *(int *)((long)piVar6 + size * 0x18 + uVar29) = (int)sVar10;
                      *(int *)((long)piVar6 + size * 0x1c + uVar29) = (int)sVar11;
                    }
                    alVar42 = ptr_02[uVar40];
                    iVar21 = 0;
                    while( true ) {
                      uVar40 = alVar42[0];
                      lVar26 = alVar42[1];
                      if (iVar23 <= iVar21) break;
                      alVar42[0] = uVar40 << 0x10;
                      alVar42[1] = lVar26 << 0x10 | uVar40 >> 0x30;
                      iVar21 = iVar21 + 1;
                    }
                    sVar32 = auVar35._0_2_;
                    auVar37._0_2_ = -(ushort)(auVar34._0_2_ < sVar32);
                    sVar38 = auVar35._2_2_;
                    auVar37._2_2_ = -(ushort)(auVar34._2_2_ < sVar38);
                    auVar37._4_2_ = -(ushort)(auVar34._4_2_ < sVar32);
                    auVar37._6_2_ = -(ushort)(auVar34._6_2_ < sVar38);
                    auVar37._8_2_ = -(ushort)(auVar34._8_2_ < sVar32);
                    auVar37._10_2_ = -(ushort)(auVar34._10_2_ < sVar38);
                    auVar37._12_2_ = -(ushort)(auVar34._12_2_ < sVar32);
                    auVar37._14_2_ = -(ushort)(auVar34._14_2_ < sVar38);
                    sVar32 = auVar39._0_2_;
                    auVar35._0_2_ = -(ushort)(sVar32 < auVar52._0_2_);
                    sVar38 = auVar39._2_2_;
                    auVar35._2_2_ = -(ushort)(sVar38 < auVar52._2_2_);
                    auVar35._4_2_ = -(ushort)(sVar32 < auVar52._4_2_);
                    auVar35._6_2_ = -(ushort)(sVar38 < auVar52._6_2_);
                    auVar35._8_2_ = -(ushort)(sVar32 < auVar52._8_2_);
                    auVar35._10_2_ = -(ushort)(sVar38 < auVar52._10_2_);
                    auVar35._12_2_ = -(ushort)(sVar32 < auVar52._12_2_);
                    auVar35._14_2_ = -(ushort)(sVar38 < auVar52._14_2_);
                    auVar35 = auVar35 | auVar37;
                    if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar35 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar35 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar35 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar35 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar35 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar35 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar35 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar35 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar35 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar35 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar35[0xf]) {
                      sVar32 = alVar42[1]._6_2_;
                    }
                    else {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      sVar32 = 0;
                      iVar16 = 0;
                      uVar25 = 0;
                    }
                    ppVar17->score = (int)sVar32;
                    ppVar17->end_query = uVar25;
                    ppVar17->end_ref = iVar16;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar17;
                  }
                  uVar20 = ptr_02[iVar21 - 1][0];
                  iVar24 = ppVar5->mapper[(byte)s2[uVar29]];
                  auVar51._8_8_ = ptr_02[iVar21 - 1][1] << 0x10 | uVar20 >> 0x30;
                  auVar51._0_8_ = uVar20 << 0x10 | (ulong)(ushort)ptr_01[uVar29];
                  auVar47 = auVar36;
                  for (lVar28 = 0; lVar26 != lVar28; lVar28 = lVar28 + 0x10) {
                    auVar49 = paddsw(auVar51,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar28 + (long)(iVar24 * iVar21) * 0x10));
                    auVar51 = *(undefined1 (*) [16])((long)*ptr_00 + lVar28);
                    sVar32 = auVar47._0_2_;
                    sVar54 = auVar51._0_2_;
                    uVar60 = (ushort)(sVar54 < sVar32) * sVar32 |
                             (ushort)(sVar54 >= sVar32) * sVar54;
                    sVar7 = auVar47._2_2_;
                    sVar55 = auVar51._2_2_;
                    uVar63 = (ushort)(sVar55 < sVar7) * sVar7 | (ushort)(sVar55 >= sVar7) * sVar55;
                    sVar8 = auVar47._4_2_;
                    sVar56 = auVar51._4_2_;
                    uVar64 = (ushort)(sVar56 < sVar8) * sVar8 | (ushort)(sVar56 >= sVar8) * sVar56;
                    sVar9 = auVar47._6_2_;
                    sVar57 = auVar51._6_2_;
                    uVar65 = (ushort)(sVar57 < sVar9) * sVar9 | (ushort)(sVar57 >= sVar9) * sVar57;
                    sVar10 = auVar47._8_2_;
                    sVar58 = auVar51._8_2_;
                    uVar66 = (ushort)(sVar58 < sVar10) * sVar10 |
                             (ushort)(sVar58 >= sVar10) * sVar58;
                    sVar11 = auVar47._10_2_;
                    sVar59 = auVar51._10_2_;
                    uVar67 = (ushort)(sVar59 < sVar11) * sVar11 |
                             (ushort)(sVar59 >= sVar11) * sVar59;
                    sVar12 = auVar47._12_2_;
                    sVar69 = auVar51._12_2_;
                    sVar71 = auVar51._14_2_;
                    uVar68 = (ushort)(sVar69 < sVar12) * sVar12 |
                             (ushort)(sVar69 >= sVar12) * sVar69;
                    sVar45 = auVar47._14_2_;
                    uVar70 = (ushort)(sVar71 < sVar45) * sVar45 |
                             (ushort)(sVar71 >= sVar45) * sVar71;
                    sVar38 = auVar49._0_2_;
                    auVar61._0_2_ =
                         (ushort)((short)uVar60 < sVar38) * sVar38 |
                         ((short)uVar60 >= sVar38) * uVar60;
                    sVar38 = auVar49._2_2_;
                    auVar61._2_2_ =
                         (ushort)((short)uVar63 < sVar38) * sVar38 |
                         ((short)uVar63 >= sVar38) * uVar63;
                    sVar38 = auVar49._4_2_;
                    auVar61._4_2_ =
                         (ushort)((short)uVar64 < sVar38) * sVar38 |
                         ((short)uVar64 >= sVar38) * uVar64;
                    sVar38 = auVar49._6_2_;
                    auVar61._6_2_ =
                         (ushort)((short)uVar65 < sVar38) * sVar38 |
                         ((short)uVar65 >= sVar38) * uVar65;
                    sVar38 = auVar49._8_2_;
                    auVar61._8_2_ =
                         (ushort)((short)uVar66 < sVar38) * sVar38 |
                         ((short)uVar66 >= sVar38) * uVar66;
                    sVar38 = auVar49._10_2_;
                    auVar61._10_2_ =
                         (ushort)((short)uVar67 < sVar38) * sVar38 |
                         ((short)uVar67 >= sVar38) * uVar67;
                    sVar38 = auVar49._12_2_;
                    auVar61._12_2_ =
                         (ushort)((short)uVar68 < sVar38) * sVar38 |
                         ((short)uVar68 >= sVar38) * uVar68;
                    sVar38 = auVar49._14_2_;
                    auVar61._14_2_ =
                         (ushort)((short)uVar70 < sVar38) * sVar38 |
                         ((short)uVar70 >= sVar38) * uVar70;
                    *(undefined1 (*) [16])((long)*ptr + lVar28) = auVar61;
                    sVar38 = auVar52._0_2_;
                    auVar43._0_2_ =
                         (sVar38 < (short)auVar61._0_2_) * auVar61._0_2_ |
                         (ushort)(sVar38 >= (short)auVar61._0_2_) * sVar38;
                    sVar38 = auVar52._2_2_;
                    auVar43._2_2_ =
                         (sVar38 < (short)auVar61._2_2_) * auVar61._2_2_ |
                         (ushort)(sVar38 >= (short)auVar61._2_2_) * sVar38;
                    sVar38 = auVar52._4_2_;
                    auVar43._4_2_ =
                         (sVar38 < (short)auVar61._4_2_) * auVar61._4_2_ |
                         (ushort)(sVar38 >= (short)auVar61._4_2_) * sVar38;
                    sVar38 = auVar52._6_2_;
                    auVar43._6_2_ =
                         (sVar38 < (short)auVar61._6_2_) * auVar61._6_2_ |
                         (ushort)(sVar38 >= (short)auVar61._6_2_) * sVar38;
                    sVar38 = auVar52._8_2_;
                    auVar43._8_2_ =
                         (sVar38 < (short)auVar61._8_2_) * auVar61._8_2_ |
                         (ushort)(sVar38 >= (short)auVar61._8_2_) * sVar38;
                    sVar38 = auVar52._10_2_;
                    auVar43._10_2_ =
                         (sVar38 < (short)auVar61._10_2_) * auVar61._10_2_ |
                         (ushort)(sVar38 >= (short)auVar61._10_2_) * sVar38;
                    sVar38 = auVar52._12_2_;
                    sVar44 = auVar52._14_2_;
                    auVar43._12_2_ =
                         (sVar38 < (short)auVar61._12_2_) * auVar61._12_2_ |
                         (ushort)(sVar38 >= (short)auVar61._12_2_) * sVar38;
                    auVar43._14_2_ =
                         (sVar44 < (short)auVar61._14_2_) * auVar61._14_2_ |
                         (ushort)(sVar44 >= (short)auVar61._14_2_) * sVar44;
                    sVar38 = auVar34._0_2_;
                    uVar60 = (ushort)(sVar54 < sVar38) * sVar54 |
                             (ushort)(sVar54 >= sVar38) * sVar38;
                    sVar38 = auVar34._2_2_;
                    uVar63 = (ushort)(sVar55 < sVar38) * sVar55 |
                             (ushort)(sVar55 >= sVar38) * sVar38;
                    sVar38 = auVar34._4_2_;
                    uVar64 = (ushort)(sVar56 < sVar38) * sVar56 |
                             (ushort)(sVar56 >= sVar38) * sVar38;
                    sVar38 = auVar34._6_2_;
                    uVar65 = (ushort)(sVar57 < sVar38) * sVar57 |
                             (ushort)(sVar57 >= sVar38) * sVar38;
                    sVar38 = auVar34._8_2_;
                    uVar66 = (ushort)(sVar58 < sVar38) * sVar58 |
                             (ushort)(sVar58 >= sVar38) * sVar38;
                    sVar38 = auVar34._10_2_;
                    uVar67 = (ushort)(sVar59 < sVar38) * sVar59 |
                             (ushort)(sVar59 >= sVar38) * sVar38;
                    sVar38 = auVar34._12_2_;
                    sVar44 = auVar34._14_2_;
                    uVar68 = (ushort)(sVar69 < sVar38) * sVar69 |
                             (ushort)(sVar69 >= sVar38) * sVar38;
                    uVar70 = (ushort)(sVar71 < sVar44) * sVar71 |
                             (ushort)(sVar71 >= sVar44) * sVar44;
                    uVar60 = (ushort)(sVar32 < (short)uVar60) * sVar32 |
                             (sVar32 >= (short)uVar60) * uVar60;
                    uVar63 = (ushort)(sVar7 < (short)uVar63) * sVar7 |
                             (sVar7 >= (short)uVar63) * uVar63;
                    uVar64 = (ushort)(sVar8 < (short)uVar64) * sVar8 |
                             (sVar8 >= (short)uVar64) * uVar64;
                    uVar65 = (ushort)(sVar9 < (short)uVar65) * sVar9 |
                             (sVar9 >= (short)uVar65) * uVar65;
                    uVar66 = (ushort)(sVar10 < (short)uVar66) * sVar10 |
                             (sVar10 >= (short)uVar66) * uVar66;
                    uVar67 = (ushort)(sVar11 < (short)uVar67) * sVar11 |
                             (sVar11 >= (short)uVar67) * uVar67;
                    uVar68 = (ushort)(sVar12 < (short)uVar68) * sVar12 |
                             (sVar12 >= (short)uVar68) * uVar68;
                    uVar70 = (ushort)(sVar45 < (short)uVar70) * sVar45 |
                             (sVar45 >= (short)uVar70) * uVar70;
                    auVar34._0_2_ =
                         ((short)auVar61._0_2_ < (short)uVar60) * auVar61._0_2_ |
                         ((short)auVar61._0_2_ >= (short)uVar60) * uVar60;
                    auVar34._2_2_ =
                         ((short)auVar61._2_2_ < (short)uVar63) * auVar61._2_2_ |
                         ((short)auVar61._2_2_ >= (short)uVar63) * uVar63;
                    auVar34._4_2_ =
                         ((short)auVar61._4_2_ < (short)uVar64) * auVar61._4_2_ |
                         ((short)auVar61._4_2_ >= (short)uVar64) * uVar64;
                    auVar34._6_2_ =
                         ((short)auVar61._6_2_ < (short)uVar65) * auVar61._6_2_ |
                         ((short)auVar61._6_2_ >= (short)uVar65) * uVar65;
                    auVar34._8_2_ =
                         ((short)auVar61._8_2_ < (short)uVar66) * auVar61._8_2_ |
                         ((short)auVar61._8_2_ >= (short)uVar66) * uVar66;
                    auVar34._10_2_ =
                         ((short)auVar61._10_2_ < (short)uVar67) * auVar61._10_2_ |
                         ((short)auVar61._10_2_ >= (short)uVar67) * uVar67;
                    auVar34._12_2_ =
                         ((short)auVar61._12_2_ < (short)uVar68) * auVar61._12_2_ |
                         ((short)auVar61._12_2_ >= (short)uVar68) * uVar68;
                    auVar34._14_2_ =
                         ((short)auVar61._14_2_ < (short)uVar70) * auVar61._14_2_ |
                         ((short)auVar61._14_2_ >= (short)uVar70) * uVar70;
                    auVar62 = psubsw(auVar61,auVar41);
                    auVar49._4_4_ = uVar33;
                    auVar49._0_4_ = uVar33;
                    auVar49._8_4_ = uVar33;
                    auVar49._12_4_ = uVar33;
                    auVar52 = psubsw(auVar51,auVar49);
                    sVar32 = auVar62._0_2_;
                    sVar45 = auVar52._0_2_;
                    sVar38 = auVar62._2_2_;
                    sVar44 = auVar52._2_2_;
                    sVar7 = auVar62._4_2_;
                    sVar54 = auVar52._4_2_;
                    sVar8 = auVar62._6_2_;
                    sVar55 = auVar52._6_2_;
                    sVar9 = auVar62._8_2_;
                    sVar56 = auVar52._8_2_;
                    sVar10 = auVar62._10_2_;
                    sVar57 = auVar52._10_2_;
                    sVar11 = auVar62._12_2_;
                    sVar58 = auVar52._12_2_;
                    sVar59 = auVar52._14_2_;
                    sVar12 = auVar62._14_2_;
                    puVar1 = (ushort *)((long)*ptr_00 + lVar28);
                    *puVar1 = (ushort)(sVar45 < sVar32) * sVar32 |
                              (ushort)(sVar45 >= sVar32) * sVar45;
                    puVar1[1] = (ushort)(sVar44 < sVar38) * sVar38 |
                                (ushort)(sVar44 >= sVar38) * sVar44;
                    puVar1[2] = (ushort)(sVar54 < sVar7) * sVar7 |
                                (ushort)(sVar54 >= sVar7) * sVar54;
                    puVar1[3] = (ushort)(sVar55 < sVar8) * sVar8 |
                                (ushort)(sVar55 >= sVar8) * sVar55;
                    puVar1[4] = (ushort)(sVar56 < sVar9) * sVar9 |
                                (ushort)(sVar56 >= sVar9) * sVar56;
                    puVar1[5] = (ushort)(sVar57 < sVar10) * sVar10 |
                                (ushort)(sVar57 >= sVar10) * sVar57;
                    puVar1[6] = (ushort)(sVar58 < sVar11) * sVar11 |
                                (ushort)(sVar58 >= sVar11) * sVar58;
                    puVar1[7] = (ushort)(sVar59 < sVar12) * sVar12 |
                                (ushort)(sVar59 >= sVar12) * sVar59;
                    auVar62._4_4_ = uVar33;
                    auVar62._0_4_ = uVar33;
                    auVar62._8_4_ = uVar33;
                    auVar62._12_4_ = uVar33;
                    auVar52 = psubsw(auVar47,auVar62);
                    sVar45 = auVar52._0_2_;
                    auVar47._0_2_ =
                         (ushort)(sVar45 < sVar32) * sVar32 | (ushort)(sVar45 >= sVar32) * sVar45;
                    sVar32 = auVar52._2_2_;
                    auVar47._2_2_ =
                         (ushort)(sVar32 < sVar38) * sVar38 | (ushort)(sVar32 >= sVar38) * sVar32;
                    sVar32 = auVar52._4_2_;
                    auVar47._4_2_ =
                         (ushort)(sVar32 < sVar7) * sVar7 | (ushort)(sVar32 >= sVar7) * sVar32;
                    sVar32 = auVar52._6_2_;
                    auVar47._6_2_ =
                         (ushort)(sVar32 < sVar8) * sVar8 | (ushort)(sVar32 >= sVar8) * sVar32;
                    sVar32 = auVar52._8_2_;
                    auVar47._8_2_ =
                         (ushort)(sVar32 < sVar9) * sVar9 | (ushort)(sVar32 >= sVar9) * sVar32;
                    sVar32 = auVar52._10_2_;
                    auVar47._10_2_ =
                         (ushort)(sVar32 < sVar10) * sVar10 | (ushort)(sVar32 >= sVar10) * sVar32;
                    sVar32 = auVar52._12_2_;
                    sVar38 = auVar52._14_2_;
                    auVar47._12_2_ =
                         (ushort)(sVar32 < sVar11) * sVar11 | (ushort)(sVar32 >= sVar11) * sVar32;
                    auVar47._14_2_ =
                         (ushort)(sVar38 < sVar12) * sVar12 | (ushort)(sVar38 >= sVar12) * sVar38;
                    auVar51 = *(undefined1 (*) [16])((long)*ptr_02 + lVar28);
                    auVar52 = auVar43;
                  }
                  for (iVar24 = 0; iVar24 != 8; iVar24 = iVar24 + 1) {
                    uVar20 = (ulong)(uint)(ptr_01[uVar29 + 1] - open);
                    if (ptr_01[uVar29 + 1] - open < -0x7fff) {
                      uVar20 = 0xffff8000;
                    }
                    uVar46 = auVar47._0_8_;
                    auVar47._8_8_ = auVar47._8_8_ << 0x10 | uVar46 >> 0x30;
                    auVar47._0_8_ = uVar46 << 0x10 | uVar20 & 0xffff;
                    lVar28 = 0;
                    auVar51 = auVar52;
                    auVar49 = auVar34;
                    while (lVar26 + 0x10 != lVar28 + 0x10) {
                      psVar2 = (short *)((long)*ptr + lVar28);
                      sVar38 = *psVar2;
                      sVar7 = psVar2[1];
                      sVar8 = psVar2[2];
                      sVar9 = psVar2[3];
                      sVar10 = psVar2[4];
                      sVar11 = psVar2[5];
                      sVar12 = psVar2[6];
                      sVar45 = psVar2[7];
                      sVar32 = auVar47._0_2_;
                      auVar50._0_2_ =
                           (ushort)(sVar38 < sVar32) * sVar32 | (ushort)(sVar38 >= sVar32) * sVar38;
                      sVar32 = auVar47._2_2_;
                      auVar50._2_2_ =
                           (ushort)(sVar7 < sVar32) * sVar32 | (ushort)(sVar7 >= sVar32) * sVar7;
                      sVar32 = auVar47._4_2_;
                      auVar50._4_2_ =
                           (ushort)(sVar8 < sVar32) * sVar32 | (ushort)(sVar8 >= sVar32) * sVar8;
                      sVar32 = auVar47._6_2_;
                      auVar50._6_2_ =
                           (ushort)(sVar9 < sVar32) * sVar32 | (ushort)(sVar9 >= sVar32) * sVar9;
                      sVar32 = auVar47._8_2_;
                      auVar50._8_2_ =
                           (ushort)(sVar10 < sVar32) * sVar32 | (ushort)(sVar10 >= sVar32) * sVar10;
                      sVar32 = auVar47._10_2_;
                      auVar50._10_2_ =
                           (ushort)(sVar11 < sVar32) * sVar32 | (ushort)(sVar11 >= sVar32) * sVar11;
                      sVar32 = auVar47._12_2_;
                      auVar50._12_2_ =
                           (ushort)(sVar12 < sVar32) * sVar32 | (ushort)(sVar12 >= sVar32) * sVar12;
                      sVar32 = auVar47._14_2_;
                      auVar50._14_2_ =
                           (ushort)(sVar45 < sVar32) * sVar32 | (ushort)(sVar45 >= sVar32) * sVar45;
                      *(undefined1 (*) [16])((long)*ptr + lVar28) = auVar50;
                      sVar32 = auVar49._0_2_;
                      auVar34._0_2_ =
                           ((short)auVar50._0_2_ < sVar32) * auVar50._0_2_ |
                           (ushort)((short)auVar50._0_2_ >= sVar32) * sVar32;
                      sVar32 = auVar49._2_2_;
                      auVar34._2_2_ =
                           ((short)auVar50._2_2_ < sVar32) * auVar50._2_2_ |
                           (ushort)((short)auVar50._2_2_ >= sVar32) * sVar32;
                      sVar32 = auVar49._4_2_;
                      auVar34._4_2_ =
                           ((short)auVar50._4_2_ < sVar32) * auVar50._4_2_ |
                           (ushort)((short)auVar50._4_2_ >= sVar32) * sVar32;
                      sVar32 = auVar49._6_2_;
                      auVar34._6_2_ =
                           ((short)auVar50._6_2_ < sVar32) * auVar50._6_2_ |
                           (ushort)((short)auVar50._6_2_ >= sVar32) * sVar32;
                      sVar32 = auVar49._8_2_;
                      auVar34._8_2_ =
                           ((short)auVar50._8_2_ < sVar32) * auVar50._8_2_ |
                           (ushort)((short)auVar50._8_2_ >= sVar32) * sVar32;
                      sVar32 = auVar49._10_2_;
                      auVar34._10_2_ =
                           ((short)auVar50._10_2_ < sVar32) * auVar50._10_2_ |
                           (ushort)((short)auVar50._10_2_ >= sVar32) * sVar32;
                      sVar32 = auVar49._12_2_;
                      sVar38 = auVar49._14_2_;
                      auVar34._12_2_ =
                           ((short)auVar50._12_2_ < sVar32) * auVar50._12_2_ |
                           (ushort)((short)auVar50._12_2_ >= sVar32) * sVar32;
                      auVar34._14_2_ =
                           ((short)auVar50._14_2_ < sVar38) * auVar50._14_2_ |
                           (ushort)((short)auVar50._14_2_ >= sVar38) * sVar38;
                      sVar32 = auVar51._0_2_;
                      auVar52._0_2_ =
                           (sVar32 < (short)auVar50._0_2_) * auVar50._0_2_ |
                           (ushort)(sVar32 >= (short)auVar50._0_2_) * sVar32;
                      sVar32 = auVar51._2_2_;
                      auVar52._2_2_ =
                           (sVar32 < (short)auVar50._2_2_) * auVar50._2_2_ |
                           (ushort)(sVar32 >= (short)auVar50._2_2_) * sVar32;
                      sVar32 = auVar51._4_2_;
                      auVar52._4_2_ =
                           (sVar32 < (short)auVar50._4_2_) * auVar50._4_2_ |
                           (ushort)(sVar32 >= (short)auVar50._4_2_) * sVar32;
                      sVar32 = auVar51._6_2_;
                      auVar52._6_2_ =
                           (sVar32 < (short)auVar50._6_2_) * auVar50._6_2_ |
                           (ushort)(sVar32 >= (short)auVar50._6_2_) * sVar32;
                      sVar32 = auVar51._8_2_;
                      auVar52._8_2_ =
                           (sVar32 < (short)auVar50._8_2_) * auVar50._8_2_ |
                           (ushort)(sVar32 >= (short)auVar50._8_2_) * sVar32;
                      sVar32 = auVar51._10_2_;
                      auVar52._10_2_ =
                           (sVar32 < (short)auVar50._10_2_) * auVar50._10_2_ |
                           (ushort)(sVar32 >= (short)auVar50._10_2_) * sVar32;
                      sVar32 = auVar51._12_2_;
                      sVar38 = auVar51._14_2_;
                      auVar52._12_2_ =
                           (sVar32 < (short)auVar50._12_2_) * auVar50._12_2_ |
                           (ushort)(sVar32 >= (short)auVar50._12_2_) * sVar32;
                      auVar52._14_2_ =
                           (sVar38 < (short)auVar50._14_2_) * auVar50._14_2_ |
                           (ushort)(sVar38 >= (short)auVar50._14_2_) * sVar38;
                      auVar51 = psubsw(auVar50,auVar41);
                      auVar13._4_4_ = uVar33;
                      auVar13._0_4_ = uVar33;
                      auVar13._8_4_ = uVar33;
                      auVar13._12_4_ = uVar33;
                      auVar47 = psubsw(auVar47,auVar13);
                      auVar53._0_2_ = -(ushort)(auVar51._0_2_ < auVar47._0_2_);
                      auVar53._2_2_ = -(ushort)(auVar51._2_2_ < auVar47._2_2_);
                      auVar53._4_2_ = -(ushort)(auVar51._4_2_ < auVar47._4_2_);
                      auVar53._6_2_ = -(ushort)(auVar51._6_2_ < auVar47._6_2_);
                      auVar53._8_2_ = -(ushort)(auVar51._8_2_ < auVar47._8_2_);
                      auVar53._10_2_ = -(ushort)(auVar51._10_2_ < auVar47._10_2_);
                      auVar53._12_2_ = -(ushort)(auVar51._12_2_ < auVar47._12_2_);
                      auVar53._14_2_ = -(ushort)(auVar51._14_2_ < auVar47._14_2_);
                      lVar28 = lVar28 + 0x10;
                      auVar51 = auVar52;
                      auVar49 = auVar34;
                      if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar53 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar53 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar53 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar53 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar53 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar53 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53._14_2_ >> 7 & 1) == 0) && (auVar53._14_2_ & 0x8000) == 0)
                      goto LAB_006b5d29;
                    }
                    auVar52 = auVar51;
                    auVar34 = auVar49;
                  }
LAB_006b5d29:
                  alVar48 = ptr[uVar40];
                  iVar24 = 0;
                  while( true ) {
                    uVar20 = alVar48[0];
                    lVar28 = alVar48[1];
                    if (iVar23 <= iVar24) break;
                    alVar48[0] = uVar20 << 0x10;
                    alVar48[1] = lVar28 << 0x10 | uVar20 >> 0x30;
                    iVar24 = iVar24 + 1;
                  }
                  ((ppVar17->field_4).rowcols)->score_row[uVar29] = (int)alVar48[1]._6_2_;
                  uVar29 = uVar29 + 1;
                  palVar18 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar22 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol_striped_profile_sse41_128_16",pcVar22);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}